

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal
          (ChElementBeamTaperedTimoshenko *this,ChMatrixRef *H,double Kfactor,double Rfactor,
          double Mfactor)

{
  ChQuaternion<double> *pCVar1;
  ChMatrixDynamic<> *xpr;
  Scalar SVar2;
  XprTypeNested pMVar3;
  undefined1 auVar4 [32];
  int iVar5;
  Scalar *pSVar6;
  ChFrame<double> *pCVar7;
  LhsNested ptr;
  element_type *peVar8;
  long lVar9;
  long lVar10;
  int i;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChMatrix33<double> AtolocwelB_1;
  ChMatrixDynamic<> CKCt;
  ChMatrixDynamic<> CK;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> CRCt;
  double node_multiplier_fact_K;
  double node_multiplier_fact_R;
  ChMatrixDynamic<> CR;
  ChVector<double> mWacc_A;
  ChVector<double> mWvel_A;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> AtolocwelA;
  ChVector<double> mWvel_B;
  ChVector<double> mXacc_A;
  ChMatrixNM<double,_12,_12> matr_loc;
  ChVector<double> mXacc_B;
  ChVector<double> mWacc_B;
  ChMatrix33<double> Atoabs;
  ChMatrixNM<double,_12,_12> KRi_loc;
  undefined1 local_d78 [72];
  _Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
  local_d30;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_d10;
  double local_cf8;
  _Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
  local_cf0;
  double local_cd8;
  undefined1 local_cd0 [80];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_c80;
  double local_c68;
  double local_c60;
  double *local_c58;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_c50;
  ChVector<double> local_c38;
  ChVector<double> local_c20;
  undefined1 local_c08 [72];
  ChMatrix33<double> local_bc0;
  ChVector<double> local_b78;
  ChVector<double> local_b60;
  ChMatrixRef local_b48;
  ChMatrixRef local_b20;
  ChMatrixRef local_af8;
  ChMatrixRef local_ad0;
  ChMatrixRef local_aa8;
  undefined1 local_a80 [1160];
  ChVector<double> local_5f8;
  ChVector<double> local_5e0;
  ChMatrix33<double> local_5c8;
  undefined1 local_580 [16];
  variable_if_dynamic<long,__1> vStack_570;
  scalar_constant_op<double> sStack_568;
  undefined1 auStack_560 [16];
  double *pdStack_550;
  _func_int *local_448 [112];
  ChMatrixRef local_c8;
  ChMatrixRef local_a0 [2];
  
  local_cf8 = Mfactor;
  local_cd0._64_8_ = Rfactor;
  local_cd0._72_8_ = Kfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0xc) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc)) {
    if ((this->tapered_section).
        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      __assert_fail("tapered_section",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                    ,0x339,
                    "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                   );
    }
    if ((((Kfactor != 0.0) || (NAN(Kfactor))) || (Rfactor != 0.0)) || (NAN(Rfactor))) {
      local_a80._0_4_ = 0xc;
      local_580._0_4_ = 0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_d10,(int *)local_a80,(int *)local_580);
      local_a80._0_4_ = 0xc;
      local_580._0_4_ = 0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_d30,(int *)local_a80,(int *)local_580);
      pCVar1 = &this->q_element_abs_rot;
      ChMatrix33<double>::Set_A_quaternion(&local_5c8,pCVar1);
      GetNodeA((ChElementBeamTaperedTimoshenko *)local_c08);
      local_580._0_8_ = *(_func_int **)(local_c08._0_8_ + 0x38);
      auVar13._0_8_ = (ulong)*(_func_int **)(local_c08._0_8_ + 0x50) ^ 0x8000000000000000;
      auVar13._8_8_ = 0x8000000000000000;
      local_580._8_8_ = -(double)*(_func_int **)(local_c08._0_8_ + 0x40);
      vStack_570.m_value = (long)-(double)*(_func_int **)(local_c08._0_8_ + 0x48);
      sStack_568.m_other = (double)vmovlpd_avx(auVar13);
      ChQuaternion<double>::operator%
                ((ChQuaternion<double> *)local_a80,(ChQuaternion<double> *)local_580,pCVar1);
      ChMatrix33<double>::Set_A_quaternion(&local_bc0,(ChQuaternion<double> *)local_a80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c08 + 8));
      GetNodeB((ChElementBeamTaperedTimoshenko *)local_d78);
      local_580._0_8_ = *(_func_int **)(local_d78._0_8_ + 0x38);
      auVar14._0_8_ = (ulong)*(_func_int **)(local_d78._0_8_ + 0x50) ^ 0x8000000000000000;
      auVar14._8_8_ = 0x8000000000000000;
      local_580._8_8_ = (ulong)*(_func_int **)(local_d78._0_8_ + 0x40) ^ 0x8000000000000000;
      vStack_570.m_value = (ulong)*(_func_int **)(local_d78._0_8_ + 0x48) ^ 0x8000000000000000;
      sStack_568.m_other = (double)vmovlpd_avx(auVar14);
      ChQuaternion<double>::operator%
                ((ChQuaternion<double> *)local_a80,(ChQuaternion<double> *)local_580,pCVar1);
      ChMatrix33<double>::Set_A_quaternion
                ((ChMatrix33<double> *)local_c08,(ChQuaternion<double> *)local_a80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
      local_cf0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_cf0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_cf0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a80._0_8_ = &local_5c8;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      emplace_back<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_cf0,(ChMatrix33<double> **)local_a80);
      local_a80._0_8_ = &local_bc0;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      emplace_back<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_cf0,(ChMatrix33<double> **)local_a80);
      local_a80._0_8_ = &local_5c8;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      emplace_back<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_cf0,(ChMatrix33<double> **)local_a80);
      local_a80._0_8_ = (ChMatrix33<double> *)local_c08;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      emplace_back<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_cf0,(ChMatrix33<double> **)local_a80);
      if (this->use_geometric_stiffness == true) {
        iVar5 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase[3])(this);
        local_a80._0_4_ = iVar5;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_cd0,(int *)local_a80);
        (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
          [6])(this,local_cd0);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_d78,
                   &this->Km,0);
        auVar4._8_8_ = local_d78._32_8_;
        auVar4._0_8_ = local_d78._24_8_;
        auVar4._16_8_ = local_d78._40_8_;
        auVar4._24_8_ = local_d78._48_8_;
        local_580._0_8_ = local_d78._0_8_;
        local_580._8_8_ = local_d78._8_8_;
        vStack_570.m_value = local_d78._16_8_;
        _auStack_560 = auVar4._8_24_;
        sStack_568.m_other = (double)local_d78._24_8_;
        Eigen::
        Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
        ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)local_a80,(Lhs *)local_580,(Rhs *)local_cd0);
        local_c50.m_storage.m_data =
             (double *)
             Eigen::internal::dense_product_base::operator_cast_to_double
                       ((dense_product_base *)local_a80);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                          *)local_d78,(double *)&local_c50,(StorageBaseType *)&this->Kg);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+
                  ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_580,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_d78);
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        Ref<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_a80,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                    *)local_580,(type *)0x0);
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
        Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_aa8,
                   &local_d10,(type *)0x0);
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_a80,
                   (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                    *)&local_cf0,4,&local_aa8);
        Eigen::internal::handmade_aligned_free((void *)local_a80._40_8_);
        ptr = (LhsNested)local_cd0._0_8_;
      }
      else {
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_a80,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Km,
                   (type *)0x0);
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
        Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_ad0,
                   &local_d10,(type *)0x0);
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_a80,
                   (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                    *)&local_cf0,4,&local_ad0);
        ptr = (LhsNested)local_a80._40_8_;
      }
      Eigen::internal::handmade_aligned_free(ptr);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_a80
                 ,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d10,(type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_af8,
                 (PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d30,
                 (type *)0x0);
      ChMatrixCorotation::ComputeKCt
                ((ChMatrixConstRef)local_a80,
                 (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  *)&local_cf0,4,&local_af8);
      Eigen::internal::handmade_aligned_free((void *)local_a80._40_8_);
      if (this->force_symmetric_stiffness == true) {
        lVar10 = 1;
        lVar9 = 0;
        while (lVar9 < (long)local_d30._M_impl.super__Vector_impl_data._M_finish + -1) {
          for (lVar11 = lVar10;
              lVar11 < (long)local_d30._M_impl.super__Vector_impl_data._M_end_of_storage;
              lVar11 = lVar11 + 1) {
            pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                                &local_d30,lVar11,lVar9);
            SVar2 = *pSVar6;
            pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                                &local_d30,lVar9,lVar11);
            *pSVar6 = SVar2;
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 1;
        }
      }
      local_a80._0_4_ = 0xc;
      local_580._0_4_ = 0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_c50,(int *)local_a80,(int *)local_580);
      local_a80._0_4_ = 0xc;
      local_580._0_4_ = 0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_c80,(int *)local_a80,(int *)local_580);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_a80
                 ,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rm,(type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_b20,
                 &local_c50,(type *)0x0);
      ChMatrixCorotation::ComputeCK
                ((ChMatrixConstRef)local_a80,
                 (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  *)&local_cf0,4,&local_b20);
      Eigen::internal::handmade_aligned_free((void *)local_a80._40_8_);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_a80
                 ,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_c50,(type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_b48,
                 &local_c80,(type *)0x0);
      ChMatrixCorotation::ComputeKCt
                ((ChMatrixConstRef)local_a80,
                 (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                  *)&local_cf0,4,&local_b48);
      Eigen::internal::handmade_aligned_free((void *)local_a80._40_8_);
      if (this->force_symmetric_stiffness == true) {
        lVar10 = 1;
        lVar9 = 0;
        while (lVar9 < local_c80.m_storage.m_rows + -1) {
          for (lVar11 = lVar10; lVar11 < local_c80.m_storage.m_cols; lVar11 = lVar11 + 1) {
            pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                                &local_c80,lVar11,lVar9);
            SVar2 = *pSVar6;
            pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                                &local_c80,lVar9,lVar11);
            *pSVar6 = SVar2;
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 1;
        }
      }
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                  *)local_d78,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_d30,
                 (double *)(local_cd0 + 0x48));
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                  *)local_cd0,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_c80,
                 (double *)(local_cd0 + 0x40));
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                   *)local_a80,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                   *)local_d78,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                   *)local_cd0);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
               *)local_580,H,0,0,0xc,0xc);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                  *)local_580,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                  *)local_a80);
      peVar8 = (this->tapered_section).
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((peVar8->compute_inertia_damping_matrix != false) ||
         (peVar8->compute_inertia_stiffness_matrix == true)) {
        Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
                  ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_580);
        local_c60 = (this->super_ChElementBeam).length * 0.5;
        local_c58 = (double *)(local_c60 * (double)local_cd0._64_8_);
        local_c60 = local_c60 * (double)local_cd0._72_8_;
        GetNodeA((ChElementBeamTaperedTimoshenko *)local_d78);
        ChFrameMoving<double>::GetWvel_loc
                  (&local_c20,(ChFrameMoving<double> *)(local_d78._0_8_ + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeA((ChElementBeamTaperedTimoshenko *)local_d78);
        ChFrameMoving<double>::GetWacc_loc
                  (&local_c38,(ChFrameMoving<double> *)(local_d78._0_8_ + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeA((ChElementBeamTaperedTimoshenko *)local_d78);
        pCVar7 = (ChFrame<double> *)(local_d78._0_8_ + 0x18);
        GetNodeA((ChElementBeamTaperedTimoshenko *)local_cd0);
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_b60,pCVar7,(ChVector<double> *)(local_cd0._0_8_ + 0xd8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_cd0 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeB((ChElementBeamTaperedTimoshenko *)local_d78);
        ChFrameMoving<double>::GetWvel_loc
                  (&local_b78,(ChFrameMoving<double> *)(local_d78._0_8_ + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeB((ChElementBeamTaperedTimoshenko *)local_d78);
        ChFrameMoving<double>::GetWacc_loc
                  (&local_5e0,(ChFrameMoving<double> *)(local_d78._0_8_ + 0x18));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeB((ChElementBeamTaperedTimoshenko *)local_d78);
        pCVar7 = (ChFrame<double> *)(local_d78._0_8_ + 0x18);
        GetNodeB((ChElementBeamTaperedTimoshenko *)local_cd0);
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_5f8,pCVar7,(ChVector<double> *)(local_cd0._0_8_ + 0xd8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_cd0 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        peVar8 = (this->tapered_section).
                 super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar8->compute_inertia_damping_matrix == true) {
          (*peVar8->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
                    (peVar8,local_a80,&local_c20,&local_c38);
          Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>_>
                      *)local_d78,(MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_a80,
                     (double *)&local_c58);
          Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_580,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>_>_>
                      *)local_d78);
          peVar8 = (this->tapered_section).
                   super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        }
        if (peVar8->compute_inertia_stiffness_matrix == true) {
          (*peVar8->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
                    (peVar8,local_a80,&local_c20,&local_c38,&local_b60,&local_b78,&local_5e0,
                     &local_5f8);
          Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>_>
                      *)local_d78,(MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_a80,
                     &local_c60);
          Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)local_580,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>_>_>
                      *)local_d78);
        }
        lVar10 = 0;
        lVar9 = 0;
        for (uVar12 = 0;
            uVar12 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar12 = uVar12 + 1) {
          local_d78._0_8_ = local_448;
          local_d78._16_8_ = local_580;
          lVar11 = lVar10 + 3;
          local_d78._24_8_ = (XprTypeNested)0x3;
          local_d78._32_8_ = 3;
          local_d78._40_8_ = (pointer)0xc;
          Eigen::
          Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
          ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
                   *)local_cd0,H,lVar11,lVar11);
          Eigen::
          MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
          ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                        *)local_cd0,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>_>
                        *)local_d78);
          local_d78._8_8_ = &sStack_568;
          local_d78._24_8_ = local_580;
          local_d78._0_8_ =
               *(long *)((long)&(((this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar9) + 0x58;
          local_d78._32_8_ = 0;
          local_d78._40_8_ = (pointer)0x3;
          local_d78._48_8_ = (pointer)0xc;
          Eigen::
          Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
          ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
                   *)local_cd0,H,lVar10,lVar11);
          Eigen::
          MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
          ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                        *)local_cd0,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>,_0>_>
                        *)local_d78);
          lVar9 = lVar9 + 0x10;
          lVar10 = lVar10 + 6;
        }
      }
      Eigen::internal::handmade_aligned_free(local_c80.m_storage.m_data);
      Eigen::internal::handmade_aligned_free(local_c50.m_storage.m_data);
      std::_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ::~_Vector_base(&local_cf0);
      Eigen::internal::handmade_aligned_free(local_d30._M_impl.super__Vector_impl_data._M_start);
      Eigen::internal::handmade_aligned_free(local_d10.m_storage.m_data);
      Mfactor = local_cf8;
    }
    else {
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               *)H);
    }
    if ((Mfactor != 0.0) || (NAN(Mfactor))) {
      local_a80._0_4_ = 0xc;
      local_580._0_4_ = 0xc;
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&local_d10,(int *)local_a80,(int *)local_580);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d10);
      if (((this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->use_lumped_mass_matrix == true) {
        xpr = &this->M;
        lVar10 = 0;
        local_c68 = 0.0;
        local_cd8 = 0.0;
        local_c08._0_8_ = (this->super_ChElementBeam).length * 0.5 * local_cf8;
        while( true ) {
          if ((ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)local_c68)
          break;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_580,xpr,
                     lVar10,lVar10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_a80,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_580,(double *)local_c08);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_bc0,
                     (Matrix<double,__1,__1,_1,__1,__1> *)&local_d10,lVar10,lVar10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     &local_bc0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_a80);
          lVar9 = lVar10 + 3;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_580,xpr,
                     lVar9,lVar9);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_a80,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_580,(double *)local_c08);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_bc0,
                     (Matrix<double,__1,__1,_1,__1,__1> *)&local_d10,lVar9,lVar9);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     &local_bc0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_a80);
          lVar11 = *(long *)((long)&(((this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + (long)local_cd8);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_bc0,xpr,
                     lVar10,lVar9);
          local_580._0_8_ = lVar11 + 0x58;
          auStack_560._0_8_ =
               local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          sStack_568.m_other =
               local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auStack_560._8_8_ =
               local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
          pdStack_550 = (double *)
                        local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[5];
          local_580._8_8_ =
               local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          vStack_570.m_value =
               (long)local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>,0>>
          ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       *)local_a80,
                      (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>,0>>
                       *)local_580,(double *)local_c08);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                    ((Matrix<double,_3,_3,_1,_3,_3> *)&local_5c8,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)local_a80);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_a80,
                     (Matrix<double,__1,__1,_1,__1,__1> *)&local_d10,lVar10,lVar9);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_a80,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_5c8);
          local_580._0_8_ = (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_5c8;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_a80,
                     (Matrix<double,__1,__1,_1,__1,__1> *)&local_d10,lVar9,lVar10);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_a80,
                     (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)
                     local_580);
          local_cd8 = (double)((long)local_cd8 + 0x10);
          lVar10 = lVar10 + 6;
          local_c68 = (double)((long)local_c68 + 1);
        }
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
        ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                 *)local_a80,H,0,0,0xc,0xc);
        Eigen::
        MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
        ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                      *)local_a80,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d10);
      }
      else {
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_a80,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->M,
                   &local_cf8);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_d10,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_a80);
        pCVar1 = &this->q_element_abs_rot;
        ChMatrix33<double>::Set_A_quaternion(&local_bc0,pCVar1);
        GetNodeA((ChElementBeamTaperedTimoshenko *)local_d78);
        local_580._0_8_ = *(_func_int **)(local_d78._0_8_ + 0x38);
        auVar15._0_8_ = (ulong)*(_func_int **)(local_d78._0_8_ + 0x50) ^ 0x8000000000000000;
        auVar15._8_8_ = 0x8000000000000000;
        local_580._8_8_ = -(double)*(_func_int **)(local_d78._0_8_ + 0x40);
        vStack_570.m_value = (long)-(double)*(_func_int **)(local_d78._0_8_ + 0x48);
        pMVar3 = (XprTypeNested)vmovlpd_avx(auVar15);
        sStack_568.m_other = (double)pMVar3;
        ChQuaternion<double>::operator%
                  ((ChQuaternion<double> *)local_a80,(ChQuaternion<double> *)local_580,pCVar1);
        ChMatrix33<double>::Set_A_quaternion
                  ((ChMatrix33<double> *)local_c08,(ChQuaternion<double> *)local_a80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d78 + 8));
        GetNodeB((ChElementBeamTaperedTimoshenko *)local_cd0);
        local_580._0_8_ = *(Index *)(local_cd0._0_8_ + 0x38);
        auVar16._0_8_ = (ulong)*(ChMatrix33<double> **)(local_cd0._0_8_ + 0x50) ^ 0x8000000000000000
        ;
        auVar16._8_8_ = 0x8000000000000000;
        local_580._8_8_ =
             (ulong)*(ChMatrix33<double> **)(local_cd0._0_8_ + 0x40) ^ 0x8000000000000000;
        vStack_570.m_value =
             (ulong)(((LhsNested)(local_cd0._0_8_ + 0x48))->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                    m_data ^ 0x8000000000000000;
        sStack_568.m_other = (double)vmovlpd_avx(auVar16);
        ChQuaternion<double>::operator%
                  ((ChQuaternion<double> *)local_a80,(ChQuaternion<double> *)local_580,pCVar1);
        ChMatrix33<double>::Set_A_quaternion
                  ((ChMatrix33<double> *)local_d78,(ChQuaternion<double> *)local_a80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_cd0 + 8));
        local_d30._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d30._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d30._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a80._0_8_ = &local_bc0;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        emplace_back<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_d30,(ChMatrix33<double> **)local_a80);
        local_a80._0_8_ = (ChMatrix33<double> *)local_c08;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        emplace_back<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_d30,(ChMatrix33<double> **)local_a80);
        local_a80._0_8_ = &local_bc0;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        emplace_back<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_d30,(ChMatrix33<double> **)local_a80);
        local_a80._0_8_ = (ChMatrix33<double> *)local_d78;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        emplace_back<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_d30,(ChMatrix33<double> **)local_a80);
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_cd0,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_d10,
                   (type *)0x0);
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = 0xc;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 0xc;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0xc;
        local_a0[0].
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)local_a80;
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_cd0,
                   (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                    *)&local_d30,4,local_a0);
        Eigen::internal::handmade_aligned_free((void *)local_cd0._40_8_);
        local_cd0._56_8_ = (pointer)0x0;
        local_cd0._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_cd0._48_8_ = (pointer)0x0;
        local_cd0._8_8_ = (pointer)0xc;
        local_cd0._16_8_ = (pointer)0xc;
        local_c8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = 0xc;
        local_c8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 0xc;
        local_cd0._24_8_ = (pointer)0xc;
        local_c8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0xc;
        local_cd0._0_8_ = (LhsNested)local_a80;
        local_c8.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)local_580;
        ChMatrixCorotation::ComputeKCt
                  ((ChMatrixConstRef)local_cd0,
                   (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                    *)&local_d30,4,&local_c8);
        Eigen::internal::handmade_aligned_free((void *)local_cd0._40_8_);
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
        ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                 *)local_cd0,H,0,0,0xc,0xc);
        Eigen::
        MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
        ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                      *)local_cd0,(MatrixBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_580
                    );
        std::
        _Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>::
        ~_Vector_base(&local_d30);
      }
      Eigen::internal::handmade_aligned_free(local_d10.m_storage.m_data);
    }
    return;
  }
  __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x338,
                "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef H,
                                                              double Kfactor,
                                                              double Rfactor,
                                                              double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(tapered_section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {
        // Corotational K stiffness:
        ChMatrixDynamic<> CK(12, 12);
        ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix

        //
        // Corotate local stiffness matrix
        //

        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector<ChMatrix33<>*> R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        if (this->use_geometric_stiffness) {
            // compute Px tension of the beam along centerline, using temporary but fast data structures:
            ChVectorDynamic<> displ(this->GetNdofs());
            this->GetStateBlock(displ);
            double Px = -this->Km.row(0) * displ;
            // ChVector<> mFo, mTo;
            // this->EvaluateSectionForceTorque(0, mFo, mTo);  // for double checking the Px value
            // GetLog() << "   Px = " << Px << "  Px_eval = " << mFo.x() << " \n";

            // corotate Km + Kg  (where Kg = this->Kg * Px)
            ChMatrixCorotation::ComputeCK(this->Km + Px * this->Kg, R, 4, CK);
        } else {
            ChMatrixCorotation::ComputeCK(this->Km, R, 4, CK);
        }
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        // For strict symmetry, copy L=U because the computations above might
        // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CKCt.rows() - 1; ++row)
                for (int col = row + 1; col < CKCt.cols(); ++col)
                    CKCt(row, col) = CKCt(col, row);
        }

        //// RADU
        //// Check if the above can be done with the one-liner:
        ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

        // The code below may be quite slow!!
        ChMatrixDynamic<> CR(12, 12);
        ChMatrixDynamic<> CRCt(12, 12);  // the global, corotated, R matrix
        ChMatrixCorotation::ComputeCK(this->Rm, R, 4, CR);
        ChMatrixCorotation::ComputeKCt(CR, R, 4, CRCt);
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CRCt.rows() - 1; ++row)
                for (int col = row + 1; col < CRCt.cols(); ++col)
                    CRCt(row, col) = CRCt(col, row);
        }

        //// For K stiffness matrix and R matrix: scale by factors
        // CKCt *= Kfactor + Rfactor * this->tapered_section->GetBeamRaleyghDamping();

        H.block(0, 0, 12, 12) = CKCt * Kfactor + CRCt * Rfactor;

        // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
        // if enabled in this beam element.
        // These matrices are not symmetric. Also note.
        if (this->tapered_section->compute_inertia_damping_matrix ||
            this->tapered_section->compute_inertia_stiffness_matrix) {
            ChMatrixNM<double, 12, 12> matr_loc;
            ChMatrixNM<double, 12, 12> KRi_loc;
            KRi_loc.setZero();
            // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
            double node_multiplier_fact_R = 0.5 * length * Rfactor;
            double node_multiplier_fact_K = 0.5 * length * Kfactor;

            ///< current angular velocity of section of node A, in material frame
            ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
            ///< current angular acceleration of section of node A, in material frame
            ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
            ///< current acceleration of section of node A, in material frame)
            ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
            ///< current angular velocity of section of node B, in material frame
            ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
            ///< current angular acceleration of section of node B, in material frame
            ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
            ///< current acceleration of section of node B, in material frame
            ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

            if (this->tapered_section->compute_inertia_damping_matrix) {
                this->tapered_section->ComputeInertiaDampingMatrix(matr_loc, mWvel_A, mWacc_A);
                KRi_loc += matr_loc * node_multiplier_fact_R;
                // check the inertial damping matrix, it should be skew symmetric
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Gyroscopic damping matrix is skew symmetric, that's correct！" << std::endl;
                //} else {
                //    std::cout << "Gyroscopic damping matrix is NOT skew symmetric, something is wrong!" << std::endl;
                //}
            }

            if (this->tapered_section->compute_inertia_stiffness_matrix) {
                this->tapered_section->ComputeInertiaStiffnessMatrix(matr_loc, mWvel_A, mWacc_A, mXacc_A, mWvel_B,
                                                                     mWacc_B, mXacc_B);
                KRi_loc += matr_loc * node_multiplier_fact_K;
                // check the inertial stiffness matrix, is it must be skew symmetric as the stiffness matrix?
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Inertial stiffness matrix is skew symmetric" << std::endl;
                //} else {
                //    std::cout << "Inertial stiffness matrix is NOT skew symmetric" << std::endl;
                //}
            }

            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by
                // construction
                H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by
                // construction
            }
        }
    } else
        H.setZero();

    //
    // The M mass matrix of this element:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // ChMatrixNM<double, 12, 12> sectional_mass = this->M;  // it could be consistent mass matrix, depends on
        // SetLumpedMassMatrix(true/false)

        if (this->tapered_section->GetLumpedMassMatrixType()) {
            double node_multiplier_fact = 0.5 * this->length * Mfactor;
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += this->M.block<3, 3>(stride, stride) * node_multiplier_fact;
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    this->M.block<3, 3>(stride + 3, stride + 3) * node_multiplier_fact;
                Mxw = nodes[i]->GetA() * this->M.block<3, 3>(stride, stride + 3) * node_multiplier_fact;
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
            // ..rather do this because lumped mass matrix does not need rotation transf.
            H.block(0, 0, 12, 12) += Mloc;

        } else {
            Mloc = this->M * Mfactor;

            // The following would be needed if consistent mass matrix is used, but...
            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            ChMatrixNM<double, 12, 12> CK;
            ChMatrixNM<double, 12, 12> CKCt;
            ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            H.block(0, 0, 12, 12) += CKCt;
        }

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }
}